

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztriangle.cpp
# Opt level: O0

void pztopology::TPZTriangle::ComputeHCurlDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions,
               TPZVec<int> *transformationIds)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  int *piVar4;
  TPZVec<int> *in_RDX;
  TPZBaseMatrix *in_RDI;
  double dVar5;
  int i_1;
  int faceOrient;
  int iEdge;
  TPZManVector<double,_3> edgeSign;
  int facePermute;
  REAL edgeLength [3];
  REAL faceArea;
  int nFaces;
  int nEdges;
  int i;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> v1;
  int64_t dim;
  TPZManVector<double,_3> *in_stack_fffffffffffffc10;
  REAL in_stack_fffffffffffffc20;
  double *in_stack_fffffffffffffc28;
  TPZFMatrix<double> *in_stack_fffffffffffffc30;
  int64_t in_stack_fffffffffffffc38;
  TPZManVector<double,_3> *in_stack_fffffffffffffc40;
  int local_11c;
  int local_114;
  TPZVec<double> local_108;
  int local_cc;
  double local_c8;
  double dStack_c0;
  double local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  int local_a0;
  TPZVec<double> local_90;
  TPZVec<double> local_58;
  int64_t local_20;
  TPZVec<int> *local_18;
  
  local_18 = in_RDX;
  local_20 = TPZBaseMatrix::Rows(in_RDI);
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28
            );
  for (local_a0 = 0; local_a0 < local_20; local_a0 = local_a0 + 1) {
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    dVar5 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_58,(long)local_a0);
    *pdVar3 = dVar5;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    dVar5 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_90,(long)local_a0);
    *pdVar3 = dVar5;
  }
  local_a4 = 3;
  local_a8 = 1;
  local_b0 = 0x3fe0000000000000;
  local_b8 = 1.0;
  local_c8 = 1.0;
  dStack_c0 = 1.4142135623730951;
  piVar4 = TPZVec<int>::operator[](local_18,3);
  local_cc = *piVar4;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,(double *)in_stack_fffffffffffffc30
            );
  for (local_114 = 0; local_114 < 3; local_114 = local_114 + 1) {
    piVar4 = TPZVec<int>::operator[](local_18,(long)local_114);
    iVar2 = *piVar4;
    pdVar3 = TPZVec<double>::operator[](&local_108,(long)local_114);
    *pdVar3 = (double)(int)(-(uint)(iVar2 != 0) | 1);
  }
  piVar4 = TPZVec<int>::operator[](local_18,3);
  iVar2 = -1;
  if (*piVar4 % 2 == 0) {
    iVar2 = 1;
  }
  for (local_11c = 0; local_11c < local_20; local_11c = local_11c + 1) {
    pdVar3 = TPZVec<double>::operator[](&local_58,(long)local_11c);
    dVar5 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_108,0);
    dVar5 = (dVar5 * *pdVar3) / local_c8;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    *pdVar3 = dVar5;
    pdVar3 = TPZVec<double>::operator[](&local_58,(long)local_11c);
    dVar5 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_90,(long)local_11c);
    dVar1 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_108,0);
    dVar5 = ((dVar5 + dVar1) * *pdVar3) / local_c8;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    *pdVar3 = dVar5;
    pdVar3 = TPZVec<double>::operator[](&local_90,(long)local_11c);
    dVar5 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_108,1);
    dVar5 = (dVar5 * 1.4142135623730951 * *pdVar3) / dStack_c0;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    *pdVar3 = dVar5;
    pdVar3 = TPZVec<double>::operator[](&local_58,(long)local_11c);
    dVar5 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_108,1);
    dVar5 = (dVar5 * -1.4142135623730951 * *pdVar3) / dStack_c0;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    *pdVar3 = dVar5;
    pdVar3 = TPZVec<double>::operator[](&local_58,(long)local_11c);
    dVar5 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_90,(long)local_11c);
    dVar1 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_108,2);
    dVar5 = (-(dVar5 + dVar1) * *pdVar3) / local_b8;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    *pdVar3 = dVar5;
    pdVar3 = TPZVec<double>::operator[](&local_90,(long)local_11c);
    dVar5 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_108,2);
    dVar5 = (-dVar5 * *pdVar3) / local_b8;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    *pdVar3 = dVar5;
    pdVar3 = TPZVec<double>::operator[](&local_58,(long)local_11c);
    dVar5 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_90,(long)local_11c);
    dVar1 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_108,0);
    dVar5 = ((dVar1 * 0.5 + dVar5) * *pdVar3) / local_c8;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    *pdVar3 = dVar5;
    pdVar3 = TPZVec<double>::operator[](&local_58,(long)local_11c);
    dVar5 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_90,(long)local_11c);
    dVar1 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_108,1);
    dVar5 = ((-dVar5 + dVar1) * 0.7071067811865476 * *pdVar3) / dStack_c0;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    *pdVar3 = dVar5;
    pdVar3 = TPZVec<double>::operator[](&local_58,(long)local_11c);
    dVar5 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_90,(long)local_11c);
    dVar1 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_108,2);
    dVar5 = ((dVar5 * -0.5 - dVar1) * *pdVar3) / local_b8;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    *pdVar3 = dVar5;
    pdVar3 = TPZVec<double>::operator[](&local_108,0);
    dVar5 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_90,(long)local_11c);
    dVar5 = (double)iVar2 * dVar5 * *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    *pdVar3 = dVar5 + dVar5;
    pdVar3 = TPZVec<double>::operator[](&local_108,1);
    dVar5 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_90,(long)local_11c);
    dVar1 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_58,(long)local_11c);
    dVar5 = (double)iVar2 * dVar5 * (-dVar1 - *pdVar3);
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    *pdVar3 = dVar5 + dVar5;
    pdVar3 = TPZVec<double>::operator[](&local_108,2);
    dVar5 = (double)iVar2 * *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_58,(long)local_11c);
    in_stack_fffffffffffffc30 = (TPZFMatrix<double> *)(dVar5 * *pdVar3 + dVar5 * *pdVar3);
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    *pdVar3 = (double)in_stack_fffffffffffffc30;
    in_stack_fffffffffffffc20 = fTangentVectors[local_cc * 2][local_11c];
    in_stack_fffffffffffffc28 =
         TPZFMatrix<double>::operator()
                   (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                    (int64_t)in_stack_fffffffffffffc20);
    *in_stack_fffffffffffffc28 = in_stack_fffffffffffffc20;
    in_stack_fffffffffffffc10 =
         *(TPZManVector<double,_3> **)
          ((long)(local_cc * 2) * 0x10 + 0x208b170 + (long)local_11c * 8);
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc30,(int64_t)in_stack_fffffffffffffc28,
                        (int64_t)in_stack_fffffffffffffc20);
    *pdVar3 = (double)in_stack_fffffffffffffc10;
  }
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc10);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc10);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc10);
  return;
}

Assistant:

void TPZTriangle::ComputeHCurlDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions, const TPZVec<int> &transformationIds)
    {
        const auto dim = gradx.Rows();
        TPZManVector<TVar, 3> v1(dim),v2(dim);
        for (int i=0; i<dim; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
        }
        constexpr auto nEdges{3}, nFaces{1};
        constexpr REAL faceArea{TPZTriangle::RefElVolume()};
        constexpr REAL edgeLength[nEdges]{1,M_SQRT2,1};
        const int facePermute = transformationIds[nEdges];
        TPZManVector<REAL,nEdges> edgeSign(nEdges,0);
        for(auto iEdge = 0; iEdge < nEdges; iEdge++){
            edgeSign[iEdge] = transformationIds[iEdge] == 0 ? 1 : -1;
        }
        const int faceOrient =  transformationIds[nEdges] % 2 == 0 ? 1 : -1;

        for (int i=0; i<dim; i++)
        {
            //v^{e,a} constant vector fields associated with edge e and vertex a
            //they are defined in such a way that v^{e,a} is normal to the edge \hat{e}
            //adjacent to edge e by the vertex a. the tangential component is set to be 1 /edgeLength[e]
            directions(i,0) = (v1[i]) * edgeSign[0] / edgeLength[0];
            directions(i,1) = (v1[i]+v2[i]) * edgeSign[0] / edgeLength[0];
            directions(i,2) = (v2[i]*M_SQRT2) * edgeSign[1] / edgeLength[1];
            directions(i,3) = (-v1[i]*M_SQRT2) * edgeSign[1] / edgeLength[1];
            directions(i,4) = (v1[i] + v2[i]) * -1 * edgeSign[2] / edgeLength[2];
            directions(i,5) = (-v2[i]) * edgeSign[2] / edgeLength[2];

            //v^{e,T} constant vector fields associated with edge e and aligned with it
            directions(i,6) = (v1[i]+0.5*v2[i]) * edgeSign[0] / edgeLength[0];
            directions(i,7) = ((-v1[i]+v2[i]) * M_SQRT1_2) * edgeSign[1] / edgeLength[1];
            directions(i,8) = (-0.5*v1[i]-v2[i]) * edgeSign[2] / edgeLength[2];

            //v^{F,e} constant vector fields associated with face F and edge e
            //they are defined in such a way that v^{F,e} is normal to the face \hat{F}
            //adjacent to face F by edge e
            directions(i,9)  = faceOrient * edgeSign[0] *  v2[i] /faceArea;//* edgeLength[0];
            directions(i,10) = faceOrient * edgeSign[1] *  (-v2[i]-v1[i]) /faceArea;//* edgeLength[1];
            directions(i,11) = faceOrient * edgeSign[2] *  v1[i] /faceArea;//* edgeLength[0];

            //v^{F,T} orthonormal vectors associated with face F and tangent to it.
            directions(i,12) = fTangentVectors[2*facePermute][i];
            directions(i,13) = fTangentVectors[2*facePermute + 1][i];
        }
    }